

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

void jieba_word_weight_free(jieba_word_weight_t *wws)

{
  long *in_RDI;
  bool bVar1;
  jieba_word_weight_t *x;
  long *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    bVar1 = false;
    if (local_10 != (long *)0x0) {
      bVar1 = *local_10 != 0;
    }
    if (!bVar1) break;
    free((void *)*local_10);
    *local_10 = 0;
    local_10 = local_10 + 2;
  }
  free(in_RDI);
  return;
}

Assistant:

void jieba_word_weight_free(jieba_word_weight_t* wws) {
  jieba_word_weight_t* x = wws;
  while (x && x->word) {
    free(x->word);
    x->word = NULL;
    x++;
  }
  free(wws);
}